

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::EndTesting(XmlReporter *this,Totals *totals)

{
  string *psVar1;
  long in_RDI;
  unsigned_long *in_stack_ffffffffffffff30;
  allocator *this_00;
  string *in_stack_ffffffffffffff38;
  allocator *this_01;
  XmlWriter *this_02;
  XmlWriter *in_stack_ffffffffffffff60;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  
  psVar1 = (string *)(in_RDI + 0x28);
  this_02 = (XmlWriter *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"OverallResults",(allocator *)this_02);
  XmlWriter::scopedElement(this_02,psVar1);
  this_01 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"successes",this_01);
  psVar1 = (string *)
           XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)this_01,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (allocator *)&stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"failures",this_00);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            ((ScopedElement *)this_01,psVar1,(unsigned_long *)this_00);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  XmlWriter::endElement(in_stack_ffffffffffffff60);
  return;
}

Assistant:

virtual void EndTesting( const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed );
            m_xml.endElement();
        }